

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void string_suite::test_escape_unicode_89AB(void)

{
  char input [9];
  decoder_type decoder;
  undefined4 local_194;
  value_type local_190 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_decoder<char> local_160;
  
  local_160.input.tail = local_190 + 8;
  builtin_memcpy(local_190,"\"\\u89AB\"",9);
  local_160.input.head = local_190;
  memset(&local_160.current,0,0x120);
  local_160.current.code = uninitialized;
  local_160.current.view.head = (const_pointer)0x0;
  local_160.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_194 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x68e,"void string_suite::test_escape_unicode_89AB()",&local_180,&local_194);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_180,&local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("decoder.string_value<std::string>()","\"\\u89AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x68f,"void string_suite::test_escape_unicode_89AB()",&local_180,anon_var_dwarf_6827);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_180._M_dataplus._M_p._4_4_,(value)local_180._M_dataplus._M_p) !=
      &local_180.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_180._M_dataplus._M_p._4_4_,(value)local_180._M_dataplus._M_p),
                    local_180.field_2._M_allocated_capacity + 1);
  }
  if (error_unexpected_token < local_160.current.code) {
    if (local_160.current.code == end) {
      local_160.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
    }
  }
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_194 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x691,"void string_suite::test_escape_unicode_89AB()",&local_180,&local_194);
  return;
}

Assistant:

void test_escape_unicode_89AB()
{
    const char input[] = "\"\\u89AB\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\u89AB");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}